

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O3

void __thiscall
fmcalc::dofm(fmcalc *this,int event_id,vector<int,_std::allocator<int>_> *items,
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *event_guls)

{
  vector<LossRec,_std::allocator<LossRec>_> *this_00;
  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
  *this_01;
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  pointer pvVar6;
  iterator iVar7;
  int *piVar8;
  undefined4 *puVar9;
  pointer pfVar10;
  pointer piVar11;
  pointer piVar12;
  long lVar13;
  pointer pfVar14;
  _Base_ptr p_Var15;
  long lVar16;
  ulong uVar17;
  pointer pvVar18;
  fmcalc *pfVar19;
  pointer pvVar20;
  _Base_ptr p_Var21;
  undefined8 extraout_RAX;
  pointer ppVar22;
  ulong uVar23;
  pointer pvVar24;
  uint uVar25;
  float *pfVar26;
  int *piVar27;
  int iVar28;
  ulong uVar29;
  size_type sVar30;
  undefined4 *puVar31;
  vector<int,_std::allocator<int>_> *this_02;
  int iVar32;
  vector<float,_std::allocator<float>_> *__range1;
  long lVar33;
  _Base_ptr __ptr;
  uint uVar34;
  int iVar35;
  fmcalc *this_03;
  long lVar36;
  long lVar37;
  pointer pvVar38;
  float fVar39;
  ulong local_128;
  map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
  outmap;
  int event_id_local;
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  avxs;
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  agg_vecs;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  aggid_to_vectorlookups;
  fmlevelrec r;
  
  event_id_local = event_id;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&aggid_to_vectorlookups,(long)this->maxLevel_ + 1,(allocator_type *)&outmap);
  pvVar38 = aggid_to_vectorlookups.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar30 = (size_type)
           *(this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (sVar30 == 0xffffffffffffffff) {
LAB_00103fc5:
    dofm();
    std::
    vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
    ::~vector(&avxs);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&aggid_to_vectorlookups);
    _Unwind_Resume(extraout_RAX);
  }
  outmap._M_t._M_impl._0_4_ = 0xfffffffe;
  std::vector<int,_std::allocator<int>_>::resize
            (aggid_to_vectorlookups.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,sVar30,(value_type_conflict1 *)&outmap);
  avxs.
  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avxs.
  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avxs.
  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ::resize(&avxs,(long)this->maxLevel_ + 1);
  pvVar1 = avxs.
           super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar20 = (event_guls->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((event_guls->
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar20) {
    local_128 = 0;
  }
  else {
    std::
    vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
    ::resize(avxs.
             super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(long)this->max_layer_ + 1);
    local_128 = 0;
    if ((pvVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_finish !=
        (pvVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_start) {
      uVar34 = 1;
      uVar17 = 0;
      do {
        iVar35 = uVar34 - 1;
        iVar28 = *(int *)(*(long *)&(((this->pfm_vec_vec_).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data +
                         (long)(items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[uVar17] * 4);
        lVar33 = (long)iVar28;
        lVar16 = (long)(pvVar38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar33 + -1];
        if (lVar16 == -2) {
          outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
          outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          outmap._M_t._M_impl._4_4_ = iVar28;
          outmap._M_t._M_impl._0_4_ =
               *(undefined4 *)
                (*(long *)(*(long *)&(((this->policy_tc_vec_vec_vec_).
                                       super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data + lVar33 * 0x18) + 4);
          std::vector<policytcvidx,_std::allocator<policytcvidx>_>::push_back
                    ((pvVar1->
                     super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1,(value_type *)&outmap);
          pvVar6 = (pvVar1->
                   super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppVar22 = *(pointer *)
                     ((long)&pvVar6[1].
                             super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl
                             .super__Vector_impl_data + 8);
          uVar17 = (long)ppVar22 -
                   *(long *)&pvVar6[1].
                             super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl
                             .super__Vector_impl_data;
          iVar7._M_current =
               *(pointer *)
                ((long)&ppVar22[-1].item_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                8);
          agg_vecs.
          super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar35;
          if (iVar7._M_current ==
              *(pointer *)
               ((long)&ppVar22[-1].item_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl +
               0x10)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&ppVar22[-1].item_idx,iVar7,(int *)&agg_vecs);
            pvVar6 = (pvVar1->
                     super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar17 = (long)*(pointer *)
                            ((long)&pvVar6[1].
                                    super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                                    _M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar6[1].
                               super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                               _M_impl.super__Vector_impl_data;
          }
          else {
            *iVar7._M_current = iVar35;
            *(int **)((long)&ppVar22[-1].item_idx.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + 8) = iVar7._M_current + 1;
          }
          (pvVar38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar33 + -1] = (int)(uVar17 >> 3) * -0x33333333 + -1;
          if (outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            operator_delete(outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          }
          local_128 = (ulong)((int)local_128 + 1);
        }
        else {
          lVar16 = *(long *)&(pvVar1->
                             super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[1].
                             super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl
                             .super__Vector_impl_data + lVar16 * 0x28;
          outmap._M_t._M_impl._0_4_ = iVar35;
          iVar7._M_current = *(int **)(lVar16 + 0x18);
          if (iVar7._M_current == *(int **)(lVar16 + 0x20)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)(lVar16 + 0x10),iVar7,(int *)&outmap);
          }
          else {
            *iVar7._M_current = iVar35;
            *(int **)(lVar16 + 0x18) = iVar7._M_current + 1;
          }
        }
        uVar17 = (ulong)uVar34;
        uVar34 = uVar34 + 1;
      } while (uVar17 < (ulong)((long)(pvVar20->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar20->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_start >> 2));
      local_128 = (ulong)(int)local_128;
    }
    if (1 < (ulong)(((long)avxs.
                           super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)avxs.
                           super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      this_03 = (fmcalc *)0x1;
      do {
        pvVar1 = avxs.
                 super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_01 = avxs.
                  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)this_03;
        std::
        vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
        ::resize(this_01,(long)this->max_layer_ + 1);
        sVar30 = (size_type)
                 (this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)this_03];
        if (sVar30 == 0xffffffffffffffff) {
          dofm(this_03);
          goto LAB_00103fc5;
        }
        this_02 = aggid_to_vectorlookups.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)this_03;
        outmap._M_t._M_impl._0_4_ = 0xfffffffe;
        std::vector<int,_std::allocator<int>_>::resize
                  (this_02,sVar30,(value_type_conflict1 *)&outmap);
        pvVar1 = pvVar1 + ((int)this_03 - 1);
        pvVar6 = (pvVar1->
                 super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar22 = pvVar6[1].super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar6[1].super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                     _M_impl.super__Vector_impl_data + 8) != ppVar22) {
          uVar17 = 0;
          do {
            pvVar18 = (this->policy_tc_vec_vec_vec_).
                      super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar28 = *(int *)(*(long *)&(this->pfm_vec_vec_).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(long)this_03].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data + (long)ppVar22[uVar17].agg_id * 4);
            lVar33 = (long)iVar28;
            lVar36 = (long)(this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar33 + -1];
            lVar16 = *(long *)&pvVar18[(long)this_03].
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data;
            uVar23 = *(long *)(lVar16 + 8 + lVar33 * 0x18) - *(long *)(lVar16 + lVar33 * 0x18);
            if (lVar36 == -2) {
              if (4 < uVar23) {
                pvVar18 = pvVar18 + (long)this_03;
                uVar23 = 1;
                do {
                  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
                  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
                  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
                  outmap._M_t._M_impl._4_4_ = iVar28;
                  outmap._M_t._M_impl._0_4_ =
                       *(undefined4 *)
                        (*(long *)(*(long *)&(pvVar18->
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             )._M_impl.super__Vector_impl_data + lVar33 * 0x18) +
                        uVar23 * 4);
                  std::vector<policytcvidx,_std::allocator<policytcvidx>_>::push_back
                            ((this_01->
                             super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar23,
                             (value_type *)&outmap);
                  pvVar6 = (this_01->
                           super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  uVar29 = (long)*(pointer *)
                                  ((long)&pvVar6[uVar23].
                                          super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           *(long *)&pvVar6[uVar23].
                                     super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                     ._M_impl.super__Vector_impl_data;
                  lVar16 = *(long *)&(pvVar1->
                                     super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[1].
                                     super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                     ._M_impl.super__Vector_impl_data;
                  piVar27 = *(int **)(lVar16 + 0x10 + uVar17 * 0x28);
                  piVar8 = *(int **)(lVar16 + 0x18 + uVar17 * 0x28);
                  if (piVar27 != piVar8) {
                    do {
                      agg_vecs.
                      super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ = *piVar27;
                      lVar16 = *(long *)&(this_01->
                                         super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar23].
                                         super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                         ._M_impl.super__Vector_impl_data;
                      iVar7._M_current = *(int **)(lVar16 + -0x10 + uVar29);
                      if (iVar7._M_current == *(int **)(lVar16 + -8 + uVar29)) {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)(lVar16 + uVar29 + -0x18),
                                   iVar7,(int *)&agg_vecs);
                      }
                      else {
                        *iVar7._M_current =
                             (int)agg_vecs.
                                  super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        *(int **)(lVar16 + uVar29 + -0x10) = iVar7._M_current + 1;
                      }
                      piVar27 = piVar27 + 1;
                    } while (piVar27 != piVar8);
                    pvVar6 = (this_01->
                             super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    uVar29 = (long)*(pointer *)
                                    ((long)&pvVar6[uVar23].
                                            super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                             *(long *)&pvVar6[uVar23].
                                       super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                       ._M_impl.super__Vector_impl_data;
                  }
                  (this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar33 + -1] =
                       (int)(uVar29 >> 3) * -0x33333333 + -1;
                  if (outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                      (_Base_ptr)0x0) {
                    operator_delete(outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                  }
                  pvVar18 = (this->policy_tc_vec_vec_vec_).
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)this_03;
                  lVar16 = *(long *)&(pvVar18->
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data;
                  uVar23 = (ulong)((int)uVar23 + 1);
                } while (uVar23 < (ulong)(*(long *)(lVar16 + 8 + lVar33 * 0x18) -
                                          *(long *)(lVar16 + lVar33 * 0x18) >> 2));
              }
            }
            else if (4 < uVar23) {
              uVar23 = 1;
              do {
                lVar16 = *(long *)&(pvVar1->
                                   super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[1].
                                   super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                                   _M_impl.super__Vector_impl_data;
                piVar27 = *(int **)(lVar16 + 0x10 + uVar17 * 0x28);
                piVar8 = *(int **)(lVar16 + 0x18 + uVar17 * 0x28);
                if (piVar27 != piVar8) {
                  do {
                    outmap._M_t._M_impl._0_4_ = *piVar27;
                    lVar16 = *(long *)&(this_01->
                                       super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar23].
                                       super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                       ._M_impl.super__Vector_impl_data + lVar36 * 0x28;
                    iVar7._M_current = *(int **)(lVar16 + 0x18);
                    if (iVar7._M_current == *(int **)(lVar16 + 0x20)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)(lVar16 + 0x10),iVar7,
                                 (int *)&outmap);
                    }
                    else {
                      *iVar7._M_current = *piVar27;
                      *(int **)(lVar16 + 0x18) = iVar7._M_current + 1;
                    }
                    piVar27 = piVar27 + 1;
                  } while (piVar27 != piVar8);
                  pvVar18 = (this->policy_tc_vec_vec_vec_).
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
                lVar16 = *(long *)&pvVar18[(long)this_03].
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data;
                uVar23 = (ulong)((int)uVar23 + 1);
              } while (uVar23 < (ulong)(*(long *)(lVar16 + 8 + lVar33 * 0x18) -
                                        *(long *)(lVar16 + lVar33 * 0x18) >> 2));
            }
            uVar17 = (ulong)((int)uVar17 + 1);
            pvVar6 = (pvVar1->
                     super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            ppVar22 = pvVar6[1].super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar23 = ((long)*(pointer *)
                             ((long)&pvVar6[1].
                                     super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                     ._M_impl.super__Vector_impl_data + 8) - (long)ppVar22 >> 3) *
                     -0x3333333333333333;
          } while (uVar17 <= uVar23 && uVar23 - uVar17 != 0);
        }
        this_03 = (fmcalc *)(ulong)((int)this_03 + 1);
        pfVar19 = (fmcalc *)
                  (((long)avxs.
                          super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)avxs.
                          super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      } while (this_03 <= pfVar19 && (long)pfVar19 - (long)this_03 != 0);
    }
  }
  std::
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  ::vector(&agg_vecs,(long)this->maxLevel_ + 1,(allocator_type *)&outmap);
  if (-1 < this->maxLevel_) {
    lVar16 = -1;
    lVar33 = 0;
    do {
      std::
      vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
      ::resize((vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                *)(CONCAT44(agg_vecs.
                            super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)agg_vecs.
                                 super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) + lVar33),
               (long)this->max_layer_ + 1);
      lVar16 = lVar16 + 1;
      lVar33 = lVar33 + 0x18;
    } while (lVar16 < this->maxLevel_);
  }
  lVar16 = *(long *)CONCAT44(agg_vecs.
                             super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)agg_vecs.
                                  super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &outmap._M_t._M_impl.super__Rb_tree_header._M_header;
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar17 = 0;
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  outmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar20 = (event_guls->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar24 = (event_guls->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pvVar24 != pvVar20) {
    this_00 = (vector<LossRec,_std::allocator<LossRec>_> *)(lVar16 + 0x18);
    do {
      pvVar2 = pvVar20 + uVar17;
      uVar34 = (uint)uVar17;
      if (uVar34 < 2) {
LAB_00103c83:
        std::vector<LossRec,_std::allocator<LossRec>_>::resize(this_00,local_128);
        puVar9 = *(undefined4 **)(lVar16 + 0x18);
        lVar33 = *(long *)(lVar16 + 0x20) - (long)puVar9;
        if (lVar33 != 0) {
          uVar17 = (lVar33 >> 5) * -0x5555555555555555;
          uVar25 = 1;
          puVar31 = puVar9;
          do {
            *puVar31 = 0;
            uVar23 = (ulong)uVar25;
            puVar31 = puVar31 + 0x18;
            uVar25 = uVar25 + 1;
          } while (uVar23 <= uVar17 && uVar17 - uVar23 != 0);
        }
        pfVar10 = (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar33 = (long)(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pfVar10;
        if (lVar33 != 0) {
          piVar11 = (items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar36 = *(long *)&(((this->pfm_vec_vec_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data;
          piVar12 = (pvVar38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar13 = *(long *)&((avxs.
                               super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[1].
                             super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl
                             .super__Vector_impl_data;
          bVar4 = this->isGULStreamType_;
          pfVar14 = (this->item_to_tiv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar28 = -1;
          iVar35 = 0;
          uVar17 = 1;
          do {
            iVar5 = *(int *)(lVar36 + (long)piVar11[uVar17 - 1] * 4);
            if (iVar28 == iVar5) {
              iVar32 = piVar12[(long)iVar28 + -1];
            }
            else {
              iVar32 = piVar12[(long)iVar5 + -1];
              iVar28 = iVar5;
              iVar35 = iVar32;
            }
            lVar37 = (long)iVar35;
            puVar9[lVar37 * 0x18] = pfVar10[uVar17 - 1] + (float)puVar9[lVar37 * 0x18];
            lVar3 = lVar13 + 0x10 + (long)iVar32 * 0x28;
            puVar9[lVar37 * 0x18 + 10] = *(undefined4 *)(lVar3 + -0xc);
            *(long *)(puVar9 + lVar37 * 0x18 + 0xe) = lVar3;
            fVar39 = 0.0;
            if (bVar4 != false) {
              fVar39 = pfVar14[piVar11[uVar17 - 1]];
            }
            puVar9[lVar37 * 0x18 + 6] = fVar39;
            puVar9[lVar37 * 0x18 + 0xb] = *(undefined4 *)(lVar13 + (long)iVar32 * 0x28);
            uVar23 = uVar17 & 0xffffffff;
            uVar17 = uVar17 + 1;
          } while (uVar23 < (ulong)(lVar33 >> 2));
        }
        dofmcalc_r(this,&aggid_to_vectorlookups,&agg_vecs,1,this->maxLevel_,&outmap,uVar34,&avxs,1,
                   items,event_guls,1);
        std::vector<LossRec,_std::allocator<LossRec>_>::_M_erase_at_end
                  (this_00,(this_00->super__Vector_base<LossRec,_std::allocator<LossRec>_>)._M_impl.
                           super__Vector_impl_data._M_start);
        pvVar20 = (event_guls->
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pvVar24 = (event_guls->
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        for (pfVar26 = (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            pfVar26 !=
            (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish; pfVar26 = pfVar26 + 1) {
          if (0.0 < *pfVar26) goto LAB_00103c83;
        }
      }
      uVar17 = (ulong)(uVar34 + 1);
      uVar23 = ((long)pvVar24 - (long)pvVar20 >> 3) * -0x5555555555555555;
    } while (uVar17 <= uVar23 && uVar23 - uVar17 != 0);
  }
  pvVar38 = aggid_to_vectorlookups.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (aggid_to_vectorlookups.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      aggid_to_vectorlookups.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      piVar11 = (pvVar38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (piVar11 != (pointer)0x0) {
        operator_delete(piVar11);
      }
      pvVar38 = pvVar38 + 1;
    } while (pvVar38 !=
             aggid_to_vectorlookups.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    aggid_to_vectorlookups.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         aggid_to_vectorlookups.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((_Rb_tree_header *)outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &outmap._M_t._M_impl.super__Rb_tree_header) {
    p_Var21 = outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      fwrite(&event_id_local,4,1,_stdout);
      fwrite(p_Var21 + 1,4,1,_stdout);
      p_Var15 = p_Var21[1]._M_left;
      for (__ptr = p_Var21[1]._M_parent; __ptr != p_Var15; __ptr = (_Base_ptr)&__ptr->_M_parent) {
        fwrite(__ptr,8,1,_stdout);
      }
      r.sidx = 0;
      r.loss = 0.0;
      fwrite(&r,8,1,_stdout);
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
    } while ((_Rb_tree_header *)p_Var21 != &outmap._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
  ::~_Rb_tree(&outmap._M_t);
  std::
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  ::~vector(&agg_vecs);
  std::
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ::~vector(&avxs);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&aggid_to_vectorlookups);
  return;
}

Assistant:

void fmcalc::dofm(int event_id, const std::vector<int> &items, std::vector<vector<OASIS_FLOAT>> &event_guls)
{
	
	const int level = 0;
	std::vector<std::vector<int>>  aggid_to_vectorlookups(maxLevel_ + 1);

	std::vector<int> &aggid_to_vectorlookup = aggid_to_vectorlookups[level];	
	int size = level_to_maxagg_id_[level];
	if (size == -1) {
		fprintf(stderr, "FATAL: Error: Possible level %d not initialized\n", level);
		exit(-1);
	}
	else {
		aggid_to_vectorlookup.resize(size, -2);
	}

	const int layer_id = 1;
	std::vector<std::vector<std::vector<policytcvidx>>> avxs;
	int total_loss_items = 0;
    avxs.resize(maxLevel_ + 1);
	if (event_guls.size() > 0) {
		auto &guls = event_guls[0];		// pick any set of events they'll all have the same size we just want the size
		std::vector<std::vector<policytcvidx>> &avx = avxs[level];

		avx.resize(max_layer_+1);
		for (unsigned int i = 0;i < guls.size();i++) {
			int agg_id = pfm_vec_vec_[level][items[i]];

			int current_idx = aggid_to_vectorlookup[agg_id-1];
			if (current_idx == -2) {
				policytcvidx a;
				a.agg_id = agg_id;
				a.policytc_id = policy_tc_vec_vec_vec_[level][agg_id][layer_id];
				avx[layer_id].push_back(a);			// populate the first layer
				avx[layer_id][avx[layer_id].size() - 1].item_idx.push_back(i);
				aggid_to_vectorlookup[agg_id-1] = (int) avx[layer_id].size() - 1;
				total_loss_items++;
			}
			else {
				avx[layer_id][current_idx].item_idx.push_back(i);
			}
			
		}
		       
		for (unsigned int zzlevel = 1;zzlevel < avxs.size();zzlevel++) {
			std::vector<std::vector<policytcvidx>>  &prev = avxs[zzlevel-1];
			std::vector<std::vector<policytcvidx>>  &next = avxs[zzlevel];
			next.resize(max_layer_ + 1);

			std::vector<int> &zzaggid_to_vectorlookup = aggid_to_vectorlookups[zzlevel]; // 
			int size = level_to_maxagg_id_[zzlevel];
			if (size == -1) {
				fprintf(stderr, "FATAL:Error possible level %d not initialized\n", zzlevel);
				exit(-1);
			}
			else {
				zzaggid_to_vectorlookup.resize(size, -2);
			}
			
			int previous_layer = 1; // previous layer is always one because only the last layer can be greater than 1

			for (unsigned int i = 0;i < prev[previous_layer].size();i++) {
				int agg_id = pfm_vec_vec_[zzlevel][prev[previous_layer][i].agg_id];
				int current_idx = zzaggid_to_vectorlookup[agg_id-1];
				if (current_idx == -2)		// field not initialized
				{

					for (unsigned int layer = 1; layer < policy_tc_vec_vec_vec_[zzlevel][agg_id].size() ; layer++ ){ // loop through layers
						struct policytcvidx a;
						const int policytc_id = policy_tc_vec_vec_vec_[zzlevel][agg_id][layer];

						a.agg_id = agg_id;
						a.policytc_id = policytc_id;

						next[layer].push_back(a);
						
						size_t current_idx = next[layer].size() - 1;
						for (int x : prev[previous_layer][i].item_idx) {
							next[layer][current_idx].item_idx.push_back(x);	
						}
						zzaggid_to_vectorlookup[agg_id-1] = (int) next[layer].size() - 1; // temp use for getting 
					}						
				}
				else {
					for (unsigned int layer = 1; layer < policy_tc_vec_vec_vec_[zzlevel][agg_id].size(); layer++) { // loop through layers
						//const int policytc_id = policy_tc_vec_vec_vec_[zzlevel][agg_id][layer];
						for (int x : prev[previous_layer][i].item_idx) {
							next[layer][current_idx].item_idx.push_back(x);	
						}
					}

				}
			}
		}
	}

	vector<vector<vector <LossRec>>>agg_vecs(maxLevel_ + 1);
	for (int i = 0; i < maxLevel_ + 1; i++) {
		agg_vecs[i].resize(max_layer_ + 1);
	}
	vector <LossRec> &agg_vec = agg_vecs[level][layer_id];
	std::map<int, std::vector<fmlevelrec>> outmap;
	
	for (unsigned int gul_idx = 0; gul_idx < event_guls.size(); gul_idx++) {    // loop sample + 1 times
		const std::vector<OASIS_FLOAT>& guls = event_guls[gul_idx];
		if (gul_idx < 2 || gulhasvalue(guls)) {
			agg_vec.resize(total_loss_items);
			//fmlevelhdr fmhdr;
			//fmhdr.event_id = event_id;
			const std::vector<std::vector<policytcvidx>> &avx = avxs[level];
			for (unsigned int i = 0; i < agg_vec.size(); i++) agg_vec[i].loss = 0;
			int last_agg_id = -1;
			int vec_idx = 0;
			for (unsigned int i = 0; i < guls.size(); i++) {
				int agg_id = pfm_vec_vec_[level][items[i]];
				if (last_agg_id != agg_id) {
					vec_idx = aggid_to_vectorlookup[agg_id - 1];
					last_agg_id = agg_id;
				}
				agg_vec[vec_idx].loss += guls[i];
				int vid = aggid_to_vectorlookup[agg_id - 1];
				agg_vec[vec_idx].agg_id = avx[1][vid].agg_id;
				agg_vec[vec_idx].item_idx = &avx[1][vid].item_idx;
				if (isGULStreamType_ == true) {
				    agg_vec[vec_idx].accumulated_tiv = item_to_tiv_[items[i]];
				} else agg_vec[vec_idx].accumulated_tiv = 0;
				agg_vec[vec_idx].policytc_id = avx[1][vid].policytc_id;
			}
			
			dofmcalc_r(aggid_to_vectorlookups, agg_vecs, level + 1, maxLevel_, outmap, gul_idx, avxs, 1, items, event_guls,1);

			agg_vec.clear();
		}
	}
	aggid_to_vectorlookups.clear();
	// Do output
	for (const auto &x : outmap) {
		fwrite(&event_id, sizeof(event_id), 1, stdout);
		fwrite(&x.first, sizeof(x.first), 1, stdout);
		for (const auto &y : x.second) {
			fwrite(&y, sizeof(y), 1, stdout);
		}
		fmlevelrec r;
		r.sidx = 0;
		r.loss = 0;
		fwrite(&r, sizeof(r), 1, stdout); // terminate rows
	}
}